

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *pIVar2;
  ImGuiTabBar *tab_bar_00;
  ulong uVar3;
  ImU32 IVar4;
  ImGuiTabItem *in_RCX;
  ImGuiTabItem *pIVar5;
  ulong uVar6;
  ImGuiTabBar *tab_bar;
  ulong uVar7;
  bool bVar8;
  
  tab_bar_00 = GImGui->CurrentTabBar;
  if (tab_bar_00 == (ImGuiTabBar *)0x0) {
    return;
  }
  if ((tab_bar_00->Flags & 0x100000) != 0) {
    return;
  }
  IVar4 = TabBarCalcTabID(tab_bar_00,label);
  if (IVar4 != 0) {
    uVar6 = (ulong)(tab_bar_00->Tabs).Size;
    bVar8 = 0 < (long)uVar6;
    if (0 < (long)uVar6) {
      in_RCX = (tab_bar_00->Tabs).Data;
      bVar8 = true;
      if (in_RCX->ID != IVar4) {
        pIVar2 = in_RCX + (uVar6 - 1);
        pIVar5 = in_RCX;
        uVar3 = 1;
        do {
          uVar7 = uVar3;
          in_RCX = pIVar2;
          if (uVar6 == uVar7) break;
          in_RCX = pIVar5 + 1;
          pIVar1 = pIVar5 + 1;
          pIVar5 = in_RCX;
          uVar3 = uVar7 + 1;
        } while (pIVar1->ID != IVar4);
        bVar8 = uVar7 < uVar6;
      }
    }
    if (bVar8) goto LAB_002ff6f6;
  }
  in_RCX = (ImGuiTabItem *)0x0;
LAB_002ff6f6:
  if (in_RCX != (ImGuiTabItem *)0x0) {
    in_RCX->WantClose = true;
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}